

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCompose.c
# Opt level: O0

DdNode * cuddBddVectorComposeRecur
                   (DdManager *dd,DdHashTable *table,DdNode *f,DdNode **vector,int deepest)

{
  int iVar1;
  DdNode *f_00;
  DdNode *pDVar2;
  DdNode *h;
  DdNode *value;
  DdHalfWord local_64;
  ptrint fanout;
  DdNode *res;
  DdNode *E;
  DdNode *T;
  DdNode *F;
  int deepest_local;
  DdNode **vector_local;
  DdNode *f_local;
  DdHashTable *table_local;
  DdManager *dd_local;
  
  f_00 = (DdNode *)((ulong)f & 0xfffffffffffffffe);
  if (f_00->index == 0x7fffffff) {
    local_64 = f_00->index;
  }
  else {
    local_64 = dd->perm[f_00->index];
  }
  dd_local = (DdManager *)f;
  if ((int)local_64 <= deepest) {
    pDVar2 = cuddHashTableLookup1(table,f_00);
    if (pDVar2 == (DdNode *)0x0) {
      pDVar2 = cuddBddVectorComposeRecur(dd,table,(f_00->type).kids.T,vector,deepest);
      if (pDVar2 == (DdNode *)0x0) {
        dd_local = (DdManager *)0x0;
      }
      else {
        *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + 1;
        h = cuddBddVectorComposeRecur(dd,table,(f_00->type).kids.E,vector,deepest);
        if (h == (DdNode *)0x0) {
          Cudd_IterDerefBdd(dd,pDVar2);
          dd_local = (DdManager *)0x0;
        }
        else {
          *(int *)(((ulong)h & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)h & 0xfffffffffffffffe) + 4) + 1;
          value = cuddBddIteRecur(dd,vector[f_00->index],pDVar2,h);
          if (value == (DdNode *)0x0) {
            Cudd_IterDerefBdd(dd,pDVar2);
            Cudd_IterDerefBdd(dd,h);
            dd_local = (DdManager *)0x0;
          }
          else {
            *(int *)(((ulong)value & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)value & 0xfffffffffffffffe) + 4) + 1;
            Cudd_IterDerefBdd(dd,pDVar2);
            Cudd_IterDerefBdd(dd,h);
            if ((f_00->ref == 1) ||
               (iVar1 = cuddHashTableInsert1(table,f_00,value,(ulong)f_00->ref - 1), iVar1 != 0)) {
              *(int *)(((ulong)value & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)value & 0xfffffffffffffffe) + 4) + -1;
              dd_local = (DdManager *)((ulong)value ^ (long)(int)(uint)(f_00 != f));
            }
            else {
              Cudd_IterDerefBdd(dd,value);
              dd_local = (DdManager *)0x0;
            }
          }
        }
      }
    }
    else {
      dd_local = (DdManager *)((ulong)pDVar2 ^ (long)(int)(uint)(f_00 != f));
    }
  }
  return &dd_local->sentinel;
}

Assistant:

static DdNode *
cuddBddVectorComposeRecur(
  DdManager * dd /* DD manager */,
  DdHashTable * table /* computed table */,
  DdNode * f /* BDD in which to compose */,
  DdNode ** vector /* functions to be composed */,
  int deepest /* depth of the deepest substitution */)
{
    DdNode      *F,*T,*E;
    DdNode      *res;

    statLine(dd);
    F = Cudd_Regular(f);

    /* If we are past the deepest substitution, return f. */
    if (cuddI(dd,F->index) > deepest) {
        return(f);
    }

    /* If problem already solved, look up answer and return. */
    if ((res = cuddHashTableLookup1(table,F)) != NULL) {
#ifdef DD_DEBUG
        bddVectorComposeHits++;
#endif
        return(Cudd_NotCond(res,F != f));
    }

    /* Split and recur on children of this node. */
    T = cuddBddVectorComposeRecur(dd,table,cuddT(F),vector, deepest);
    if (T == NULL) return(NULL);
    cuddRef(T);
    E = cuddBddVectorComposeRecur(dd,table,cuddE(F),vector, deepest);
    if (E == NULL) {
        Cudd_IterDerefBdd(dd, T);
        return(NULL);
    }
    cuddRef(E);

    /* Call cuddBddIteRecur with the BDD that replaces the current top
    ** variable and the T and E we just created.
    */
    res = cuddBddIteRecur(dd,vector[F->index],T,E);
    if (res == NULL) {
        Cudd_IterDerefBdd(dd, T);
        Cudd_IterDerefBdd(dd, E);
        return(NULL);
    }
    cuddRef(res);
    Cudd_IterDerefBdd(dd, T);
    Cudd_IterDerefBdd(dd, E);   

    /* Do not keep the result if the reference count is only 1, since
    ** it will not be visited again.
    */
    if (F->ref != 1) {
        ptrint fanout = (ptrint) F->ref;
        cuddSatDec(fanout);
        if (!cuddHashTableInsert1(table,F,res,fanout)) {
            Cudd_IterDerefBdd(dd, res);
            return(NULL);
        }
    }
    cuddDeref(res);
    return(Cudd_NotCond(res,F != f));

}